

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void matras_stats_test(void)

{
  void *pvVar1;
  undefined1 local_90 [8];
  matras_view view;
  undefined1 local_68 [4];
  matras_id_t id;
  matras matras;
  matras_stats stats;
  
  _space(_stdout);
  printf("# *** %s ***\n","matras_stats_test");
  plan(0xc);
  matras_stats_create((matras_stats *)&matras.stats);
  _ok((uint)((int)matras.stats == 0),"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x123,
      "line %d");
  _ok((uint)(matras.stats._4_4_ == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x124,
      "line %d");
  extents_in_use = 0;
  matras_create((matras *)local_68,8,&ver_allocator,(matras_stats *)&matras.stats);
  _ok((uint)((int)matras.stats == 0),"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x129,
      "line %d");
  _ok((uint)(matras.stats._4_4_ == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12a,
      "line %d");
  pvVar1 = matras_alloc((matras *)local_68,(matras_id_t *)((long)&view.next_view + 4));
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "matras_alloc(&matras, &id) != NULL","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
            0x12d,"matras_stats_test");
    exit(-1);
  }
  _ok((uint)((int)matras.stats == 3),"stats.extent_count == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12e,
      "line %d");
  _ok((uint)(matras.stats._4_4_ == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x12f,
      "line %d");
  matras_create_read_view((matras *)local_68,(matras_view *)local_90);
  pvVar1 = matras_touch((matras *)local_68,view.next_view._4_4_);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
            "matras_touch(&matras, id) != NULL","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
            0x133,"matras_stats_test");
    exit(-1);
  }
  _ok((uint)((int)matras.stats == 6),"stats.extent_count == 6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x134,
      "line %d");
  _ok((uint)(matras.stats._4_4_ == 3),"stats.read_view_extent_count == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x135,
      "line %d");
  matras_destroy_read_view((matras *)local_68,(matras_view *)local_90);
  _ok((uint)((int)matras.stats == 3),"stats.extent_count == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x138,
      "line %d");
  _ok((uint)(matras.stats._4_4_ == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x139,
      "line %d");
  matras_destroy((matras *)local_68);
  _ok((uint)((int)matras.stats == 0),"stats.extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13c,
      "line %d");
  _ok((uint)(matras.stats._4_4_ == 0),"stats.read_view_extent_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x13d,
      "line %d");
  _space(_stdout);
  printf("# *** %s: done ***\n","matras_stats_test");
  check_plan();
  return;
}

Assistant:

void
matras_stats_test()
{
	header();
	plan(12);

	struct matras_stats stats;
	matras_stats_create(&stats);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	extents_in_use = 0;
	struct matras matras;
	matras_create(&matras, sizeof(type_t), &ver_allocator, &stats);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	matras_id_t id;
	fail_unless(matras_alloc(&matras, &id) != NULL);
	ok(stats.extent_count == 3);
	ok(stats.read_view_extent_count == 0);

	struct matras_view view;
	matras_create_read_view(&matras, &view);
	fail_unless(matras_touch(&matras, id) != NULL);
	ok(stats.extent_count == 6);
	ok(stats.read_view_extent_count == 3);

	matras_destroy_read_view(&matras, &view);
	ok(stats.extent_count == 3);
	ok(stats.read_view_extent_count == 0);

	matras_destroy(&matras);
	ok(stats.extent_count == 0);
	ok(stats.read_view_extent_count == 0);

	footer();
	check_plan();
}